

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_default_vfs_tell(ma_vfs *pVFS,ma_vfs_file file,ma_int64 *pCursor)

{
  ma_int64 *in_RDX;
  ma_vfs_file in_RSI;
  ma_vfs *in_RDI;
  undefined4 local_4;
  
  if (in_RDX == (ma_int64 *)0x0) {
    local_4 = MA_INVALID_ARGS;
  }
  else {
    *in_RDX = 0;
    if (in_RSI == (ma_vfs_file)0x0) {
      local_4 = MA_INVALID_ARGS;
    }
    else {
      local_4 = ma_default_vfs_tell__stdio(in_RDI,in_RSI,in_RDX);
    }
  }
  return local_4;
}

Assistant:

static ma_result ma_default_vfs_tell(ma_vfs* pVFS, ma_vfs_file file, ma_int64* pCursor)
{
    if (pCursor == NULL) {
        return MA_INVALID_ARGS;
    }

    *pCursor = 0;

    if (file == NULL) {
        return MA_INVALID_ARGS;
    }

#if defined(MA_USE_WIN32_FILEIO)
    return ma_default_vfs_tell__win32(pVFS, file, pCursor);
#else
    return ma_default_vfs_tell__stdio(pVFS, file, pCursor);
#endif
}